

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O3

void __thiscall crnlib::qdxt5::clear(qdxt5 *this)

{
  uint uVar1;
  void *pvVar2;
  raw_node *prVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  uint i;
  ulong uVar7;
  vector<crnlib::vector<unsigned_int>_> *pvVar8;
  vector<unsigned_int> *pvVar9;
  
  this->m_main_thread_id = 0;
  *(undefined8 *)&this->m_num_blocks = 0;
  *(undefined8 *)((long)&this->m_pBlocks + 4) = 0;
  *(undefined8 *)((long)&this->m_pDst_elements + 4) = 0;
  (this->m_params).m_quality_level = 0xff;
  (this->m_params).m_dxt_quality = cCRNDXTQualityUber;
  (this->m_params).m_num_mips = 0;
  (this->m_params).m_pProgress_func = (progress_callback_func)0x0;
  (this->m_params).m_pProgress_data = (void *)0x0;
  (this->m_params).m_hierarchical = true;
  memset((this->m_params).m_mip_desc,0,0x600);
  (this->m_params).m_comp_index = 3;
  (this->m_params).m_progress_start = 0;
  (this->m_params).m_progress_range = 100;
  (this->m_params).m_use_both_block_types = true;
  clusterizer<crnlib::vec<2U,_float>_>::clear(&this->m_endpoint_clusterizer);
  pvVar9 = (this->m_endpoint_cluster_indices).m_p;
  if (pvVar9 != (vector<unsigned_int> *)0x0) {
    uVar7 = (ulong)(this->m_endpoint_cluster_indices).m_size;
    if (uVar7 != 0) {
      lVar6 = 0;
      do {
        pvVar2 = *(void **)((long)&pvVar9->m_p + lVar6);
        if (pvVar2 != (void *)0x0) {
          crnlib_free(pvVar2);
        }
        lVar6 = lVar6 + 0x10;
      } while (uVar7 << 4 != lVar6);
      pvVar9 = (this->m_endpoint_cluster_indices).m_p;
    }
    crnlib_free(pvVar9);
    (this->m_endpoint_cluster_indices).m_p = (vector<unsigned_int> *)0x0;
    (this->m_endpoint_cluster_indices).m_size = 0;
    (this->m_endpoint_cluster_indices).m_capacity = 0;
  }
  this->m_max_selector_clusters = 0;
  this->m_canceled = false;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  lVar6 = 0;
  do {
    clusterizer<crnlib::vec<16U,_float>_>::clear
              ((clusterizer<crnlib::vec<16U,_float>_> *)
               ((long)&(this->m_selector_clusterizer).m_clusterizers[0].m_training_vecs.m_p + lVar6)
              );
    lVar6 = lVar6 + 0x70;
  } while (lVar6 != 0x1c0);
  lVar6 = 0;
  do {
    pvVar9 = this->m_cached_selector_cluster_indices[lVar6].m_p;
    if (pvVar9 != (vector<unsigned_int> *)0x0) {
      pvVar8 = this->m_cached_selector_cluster_indices + lVar6;
      uVar1 = pvVar8->m_size;
      if ((ulong)uVar1 != 0) {
        lVar4 = 0;
        do {
          pvVar2 = *(void **)((long)&pvVar9->m_p + lVar4);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar4 = lVar4 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar4);
        pvVar9 = pvVar8->m_p;
      }
      crnlib_free(pvVar9);
      pvVar8->m_p = (vector<unsigned_int> *)0x0;
      pvVar8->m_size = 0;
      pvVar8->m_capacity = 0;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  uVar7 = (ulong)(this->m_cluster_hash).m_values.m_size;
  if (uVar7 != 0) {
    prVar3 = (this->m_cluster_hash).m_values.m_p;
    uVar5 = (this->m_cluster_hash).m_num_valid;
    lVar6 = 0;
    do {
      if (prVar3[lVar6 + 0x1c] != (raw_node)0x0) {
        pvVar2 = *(void **)(prVar3 + lVar6);
        if (pvVar2 != (void *)0x0) {
          crnlib_free(pvVar2);
        }
        uVar5 = uVar5 - 1;
        if (uVar5 == 0) break;
      }
      lVar6 = lVar6 + 0x20;
    } while (uVar7 << 5 != lVar6);
    prVar3 = (this->m_cluster_hash).m_values.m_p;
    if (prVar3 != (raw_node *)0x0) {
      crnlib_free(prVar3);
      (this->m_cluster_hash).m_values.m_p = (raw_node *)0x0;
      (this->m_cluster_hash).m_values.m_size = 0;
      (this->m_cluster_hash).m_values.m_capacity = 0;
    }
    (this->m_cluster_hash).m_hash_shift = 0x20;
    (this->m_cluster_hash).m_num_valid = 0;
    (this->m_cluster_hash).m_grow_threshold = 0;
  }
  this->m_prev_percentage_complete = -1;
  return;
}

Assistant:

void qdxt5::clear() {
  m_main_thread_id = 0;
  m_num_blocks = 0;
  m_pBlocks = 0;
  m_pDst_elements = NULL;
  m_elements_per_block = 0;
  m_params.clear();
  m_endpoint_clusterizer.clear();
  m_endpoint_cluster_indices.clear();
  m_max_selector_clusters = 0;
  m_canceled = false;
  m_progress_start = 0;
  m_progress_range = 100;
  m_selector_clusterizer.clear();

  for (uint i = 0; i <= qdxt5_params::cMaxQuality; i++)
    m_cached_selector_cluster_indices[i].clear();

  m_cluster_hash.clear();

  m_prev_percentage_complete = -1;
}